

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::TrimCapabilitiesPass::addInstructionRequirementsForOpcode
          (TrimCapabilitiesPass *this,Op opcode,CapabilitySet *capabilities,ExtensionSet *extensions
          )

{
  uint uVar1;
  spv_opcode_desc psVar2;
  bool bVar3;
  spv_result_t sVar4;
  uint32_t uVar5;
  long lVar6;
  ulong uVar7;
  Extension *value;
  Capability capability;
  spv_opcode_desc_t *desc;
  Capability local_64;
  spv_opcode_desc local_60;
  ulong local_58;
  pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> local_50;
  
  if ((0xf < opcode - OpGroupNonUniformIAdd) && (1 < opcode - OpBeginInvocationInterlockEXT)) {
    local_60 = (spv_opcode_desc)0x0;
    sVar4 = AssemblyGrammar::lookupOpcode(&((this->super_Pass).context_)->grammar_,opcode,&local_60)
    ;
    psVar2 = local_60;
    if (sVar4 == SPV_SUCCESS) {
      local_58 = (ulong)local_60->numCapabilities;
      if (local_58 != 0) {
        uVar7 = 0;
        do {
          local_64 = psVar2->capabilities[uVar7];
          bVar3 = EnumSet<spv::Capability>::contains(&this->supportedCapabilities_,local_64);
          if (bVar3) {
            EnumSet<spv::Capability>::insert(&local_50,capabilities,&local_64);
          }
          uVar7 = uVar7 + 1;
        } while (local_58 != uVar7);
      }
      psVar2 = local_60;
      uVar1 = local_60->minVersion;
      uVar5 = spvVersionForTargetEnv(((this->super_Pass).context_)->syntax_context_->target_env);
      if ((uVar5 < uVar1) && (uVar7 = (ulong)psVar2->numExtensions, uVar7 != 0)) {
        value = psVar2->extensions;
        lVar6 = uVar7 << 2;
        do {
          EnumSet<spvtools::Extension>::insert
                    ((pair<spvtools::EnumSet<spvtools::Extension>::Iterator,_bool> *)&local_50,
                     extensions,value);
          value = value + 1;
          lVar6 = lVar6 + -4;
        } while (lVar6 != 0);
      }
    }
    return;
  }
  return;
}

Assistant:

bool hasOpcodeConflictingCapabilities(spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpBeginInvocationInterlockEXT:
    case spv::Op::OpEndInvocationInterlockEXT:
    case spv::Op::OpGroupNonUniformIAdd:
    case spv::Op::OpGroupNonUniformFAdd:
    case spv::Op::OpGroupNonUniformIMul:
    case spv::Op::OpGroupNonUniformFMul:
    case spv::Op::OpGroupNonUniformSMin:
    case spv::Op::OpGroupNonUniformUMin:
    case spv::Op::OpGroupNonUniformFMin:
    case spv::Op::OpGroupNonUniformSMax:
    case spv::Op::OpGroupNonUniformUMax:
    case spv::Op::OpGroupNonUniformFMax:
    case spv::Op::OpGroupNonUniformBitwiseAnd:
    case spv::Op::OpGroupNonUniformBitwiseOr:
    case spv::Op::OpGroupNonUniformBitwiseXor:
    case spv::Op::OpGroupNonUniformLogicalAnd:
    case spv::Op::OpGroupNonUniformLogicalOr:
    case spv::Op::OpGroupNonUniformLogicalXor:
      return true;
    default:
      return false;
  }
}